

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O2

Gia_Man_t * Gia_ManFromAigChoices(Aig_Man_t *p)

{
  int iVar1;
  Gia_Man_t *p_00;
  char *pcVar2;
  int *piVar3;
  void *pvVar4;
  Aig_Obj_t *pObj;
  int iVar5;
  Vec_Ptr_t *p_01;
  
  if (p->pEquivs != (Aig_Obj_t **)0x0) {
    p_00 = Gia_ManStart(p->vObjs->nSize - p->nDeleted);
    pcVar2 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar2;
    pcVar2 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar2;
    p_00->nConstrs = p->nConstrs;
    piVar3 = (int *)calloc((long)p->vObjs->nSize - (long)p->nDeleted,4);
    p_00->pSibls = piVar3;
    Aig_ManCleanData(p);
    (p->pConst1->field_5).iData = 1;
    for (iVar5 = 0; iVar5 < p->vCis->nSize; iVar5 = iVar5 + 1) {
      pvVar4 = Vec_PtrEntry(p->vCis,iVar5);
      iVar1 = Gia_ManAppendCi(p_00);
      *(int *)((long)pvVar4 + 0x28) = iVar1;
    }
    iVar5 = 0;
    while( true ) {
      p_01 = p->vCos;
      iVar1 = p_01->nSize;
      if (iVar1 <= iVar5) break;
      pvVar4 = Vec_PtrEntry(p_01,iVar5);
      Gia_ManFromAigChoices_rec
                (p_00,p,(Aig_Obj_t *)(*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe));
      iVar5 = iVar5 + 1;
    }
    for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
      pObj = (Aig_Obj_t *)Vec_PtrEntry(p_01,iVar5);
      iVar1 = Gia_ObjChild0Copy(pObj);
      Gia_ManAppendCo(p_00,iVar1);
      p_01 = p->vCos;
      iVar1 = p_01->nSize;
    }
    Gia_ManSetRegNum(p_00,p->nRegs);
    return p_00;
  }
  __assert_fail("p->pEquivs != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaAig.c"
                ,0x8a,"Gia_Man_t *Gia_ManFromAigChoices(Aig_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManFromAigChoices( Aig_Man_t * p )
{
    Gia_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( p->pEquivs != NULL );
    // create the new manager
    pNew = Gia_ManStart( Aig_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    // create room to store equivalences
    pNew->pSibls = ABC_CALLOC( int, Aig_ManObjNum(p) );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->iData = 1;
    Aig_ManForEachCi( p, pObj, i )
        pObj->iData = Gia_ManAppendCi( pNew );
    // add logic for the POs
    Aig_ManForEachCo( p, pObj, i )
        Gia_ManFromAigChoices_rec( pNew, p, Aig_ObjFanin0(pObj) );        
    Aig_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjChild0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    //assert( Gia_ManObjNum(pNew) == Aig_ManObjNum(p) );
    return pNew;
}